

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rules_tria.cc
# Opt level: O3

QuadRule * lf::quad::detail::HardcodedQuadRule<(lf::base::RefElType)3,5>(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_68;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  VectorXd local_38;
  MatrixXd local_28;
  
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  local_68.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_68,2,7);
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,7);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,0)
  ;
  *pSVar1 = 0.10128650732345626;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,0)
  ;
  *pSVar1 = 0.1012865073234565;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,1)
  ;
  *pSVar1 = 0.7974269853530872;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,1)
  ;
  *pSVar1 = 0.10128650732345625;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,2)
  ;
  *pSVar1 = 0.10128650732345651;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,2)
  ;
  *pSVar1 = 0.7974269853530874;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,3)
  ;
  *pSVar1 = 0.47014206410511505;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,3)
  ;
  *pSVar1 = 0.059715871789769885;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,4)
  ;
  *pSVar1 = 0.47014206410511505;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,4)
  ;
  *pSVar1 = 0.4701420641051151;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,5)
  ;
  *pSVar1 = 0.05971587178976978;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,5)
  ;
  *pSVar1 = 0.4701420641051153;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,6)
  ;
  *pSVar1 = 0.33333333333333326;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,6)
  ;
  *pSVar1 = 0.3333333333333334;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,0);
  *pSVar2 = 0.06296959027241358;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,1);
  *pSVar2 = 0.06296959027241358;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,2);
  *pSVar2 = 0.06296959027241358;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,3);
  *pSVar2 = 0.0661970763942531;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,4);
  *pSVar2 = 0.0661970763942531;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,5);
  *pSVar2 = 0.0661970763942531;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,6);
  *pSVar2 = 0.11250000000000002;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_68.m_storage.m_data;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_68.m_storage.m_rows;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_68.m_storage.m_cols;
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  local_68.m_storage.m_cols = 0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_48.m_storage.m_data;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_48.m_storage.m_rows;
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x3,&local_28,&local_38,5);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_48.m_storage.m_data);
  free(local_68.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule HardcodedQuadRule<base::RefEl::kTria(), 5>() { // NOLINT
  Eigen::MatrixXd points(2, 7);
  Eigen::VectorXd weights(7);

  points(0, 0) = 0.10128650732345625962;
  points(1, 0) = 0.10128650732345649554;
  points(0, 1) = 0.7974269853530872032;
  points(1, 1) = 0.10128650732345624574;
  points(0, 2) = 0.10128650732345650942;
  points(1, 2) = 0.79742698535308742525;
  points(0, 3) = 0.47014206410511505396;
  points(1, 3) = 0.059715871789769885136;
  points(0, 4) = 0.47014206410511505396;
  points(1, 4) = 0.47014206410511510947;
  points(0, 5) = 0.059715871789769781053;
  points(1, 5) = 0.47014206410511527601;
  points(0, 6) = 0.33333333333333325932;
  points(1, 6) = 0.33333333333333342585;

  weights(0) = 0.062969590272413583643;
  weights(1) = 0.062969590272413583643;
  weights(2) = 0.062969590272413583643;
  weights(3) = 0.066197076394253095977;
  weights(4) = 0.066197076394253095977;
  weights(5) = 0.066197076394253095977;
  weights(6) = 0.11250000000000001665;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights), 5);
}